

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void relational_suite::compare_string_with_boolean_literal(void)

{
  undefined1 local_21a;
  bool local_219;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1dc [2];
  undefined1 local_1da;
  bool local_1d9;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_19c [2];
  undefined1 local_19a;
  bool local_199;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15c [2];
  undefined1 local_15a;
  bool local_159;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11c [2];
  undefined1 local_11a;
  bool local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_dc [2];
  undefined1 local_da;
  bool local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9c [2];
  undefined1 local_9a;
  bool local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [20];
  undefined1 local_4a;
  bool local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,"alpha");
  local_49 = false;
  local_a[0] = trial::dynamic::operator<(&local_48,&local_49);
  local_4a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") < false","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1b44,"void relational_suite::compare_string_with_boolean_literal()",local_a,
             &local_4a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_98,"alpha");
  local_99 = false;
  local_5e[0] = trial::dynamic::operator<=(&local_98,&local_99);
  local_9a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") <= false","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1b45,"void relational_suite::compare_string_with_boolean_literal()",local_5e,
             &local_9a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,"alpha");
  local_d9 = false;
  local_9c[0] = trial::dynamic::operator>(&local_d8,&local_d9);
  local_da = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") > false","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1b46,"void relational_suite::compare_string_with_boolean_literal()",local_9c,
             &local_da);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_118,"alpha");
  local_119 = false;
  local_dc[0] = trial::dynamic::operator>=(&local_118,&local_119);
  local_11a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") >= false","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1b47,"void relational_suite::compare_string_with_boolean_literal()",local_dc,
             &local_11a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_158,"alpha");
  local_159 = true;
  local_11c[0] = trial::dynamic::operator<(&local_158,&local_159);
  local_15a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") < true","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1b49,"void relational_suite::compare_string_with_boolean_literal()",local_11c,
             &local_15a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,"alpha");
  local_199 = true;
  local_15c[0] = trial::dynamic::operator<=(&local_198,&local_199);
  local_19a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") <= true","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1b4a,"void relational_suite::compare_string_with_boolean_literal()",local_15c,
             &local_19a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1d8,"alpha");
  local_1d9 = true;
  local_19c[0] = trial::dynamic::operator>(&local_1d8,&local_1d9);
  local_1da = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") > true","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1b4b,"void relational_suite::compare_string_with_boolean_literal()",local_19c,
             &local_1da);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_218,"alpha");
  local_219 = true;
  local_1dc[0] = trial::dynamic::operator>=(&local_218,&local_219);
  local_21a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") >= true","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1b4c,"void relational_suite::compare_string_with_boolean_literal()",local_1dc,
             &local_21a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  return;
}

Assistant:

void compare_string_with_boolean_literal()
{
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") < false, false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") <= false, false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") > false, true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") >= false, true);

    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") < true, false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") <= true, false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") > true, true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") >= true, true);
}